

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

trie_node *
trie_lookup_exact(trie_node *root_node,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl,_Bool *found)

{
  long lVar1;
  undefined1 (*pauVar2) [12];
  lrtr_ip_addr a;
  lrtr_ip_addr prefix_00;
  lrtr_ip_addr b;
  _Bool _Var3;
  trie_node *ptVar4;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff8c;
  lrtr_ip_version in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 uStack_50;
  undefined4 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *found = false;
  if (root_node == (trie_node *)0x0) {
    root_node = (trie_node *)0x0;
  }
  else {
    while ((*lvl == 0 || (root_node->len <= mask_len))) {
      if (root_node->len == mask_len) {
        local_48 = (prefix->u).addr6.addr[3];
        pauVar2 = (undefined1 (*) [12])((long)&prefix->u + 4);
        uStack_50 = *(undefined8 *)*pauVar2;
        in_stack_ffffffffffffff90 = (lrtr_ip_version)*(undefined8 *)prefix;
        a.u.addr6.addr[2] = in_stack_ffffffffffffff8c;
        a._0_12_ = *(undefined1 (*) [12])((long)&(root_node->prefix).u + 4);
        a.u.addr6.addr[3] = in_stack_ffffffffffffff90;
        b.u.addr6.addr[2] = in_stack_ffffffffffffffa4;
        b._0_12_ = *pauVar2;
        b.u.addr6.addr[3] = in_stack_ffffffffffffff90;
        _Var3 = lrtr_ip_addr_equal(a,b);
        if (_Var3) {
          *found = true;
          goto LAB_00113f56;
        }
      }
      lrtr_ip_addr_get_bits((lrtr_ip_addr *)&stack0xffffffffffffffa8,prefix,(uint8_t)*lvl,'\x01');
      prefix_00.u.addr6.addr[1] = local_48;
      prefix_00._0_8_ = uStack_50;
      prefix_00.u.addr6.addr[2] = in_stack_ffffffffffffff8c;
      prefix_00.u.addr6.addr[3] = in_stack_ffffffffffffff90;
      _Var3 = lrtr_ip_addr_is_zero(prefix_00);
      if (_Var3) {
        ptVar4 = root_node->lchild;
      }
      else {
        ptVar4 = root_node->rchild;
      }
      if (ptVar4 == (trie_node *)0x0) goto LAB_00113f56;
      *lvl = *lvl + 1;
      root_node = ptVar4;
    }
    *lvl = *lvl - 1;
    root_node = root_node->parent;
  }
LAB_00113f56:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return root_node;
  }
  __stack_chk_fail();
}

Assistant:

struct trie_node *trie_lookup_exact(struct trie_node *root_node, const struct lrtr_ip_addr *prefix,
				    const uint8_t mask_len, unsigned int *lvl, bool *found)
{
	*found = false;

	while (root_node) {
		if (*lvl > 0 && root_node->len > mask_len) {
			(*lvl)--;
			return root_node->parent;
		}

		if (root_node->len == mask_len && lrtr_ip_addr_equal(root_node->prefix, *prefix)) {
			*found = true;
			return root_node;
		}

		if (is_left_child(prefix, *lvl)) {
			if (!root_node->lchild)
				return root_node;
			root_node = root_node->lchild;
		} else {
			if (!root_node->rchild)
				return root_node;
			root_node = root_node->rchild;
		}

		(*lvl)++;
	}
	return NULL;
}